

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxTrackBuilder.cpp
# Opt level: O0

void __thiscall FluxTrackBuilder::addWeakBlock(FluxTrackBuilder *this,int length)

{
  uint local_18;
  int local_14;
  FluxTrackBuilder *pFStack_10;
  int length_local;
  FluxTrackBuilder *this_local;
  
  local_14 = length;
  pFStack_10 = this;
  addRawBit(this,true);
  addRawBit(this,true);
  local_14 = (local_14 * 0x15) / 2;
  while (0 < local_14) {
    local_18 = this->m_bitcell_ns * 3 >> 1;
    local_14 = local_14 + -1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_flux_times,&local_18);
  }
  return;
}

Assistant:

void FluxTrackBuilder::addWeakBlock(int length)
{
    // Flush out previous constant block.
    addRawBit(1);
    addRawBit(1);

    // Approximately 11 ambigious reversals per weak byte.
    length = length * 21 / 2;

    while (length-- > 0)
        m_flux_times.push_back(m_bitcell_ns * 3 / 2);
}